

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_by_name.hpp
# Opt level: O1

vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> * __thiscall
duckdb::UnionByName::UnionCols<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
          (vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> *__return_storage_ptr__,
          UnionByName *this,ClientContext *context,vector<duckdb::OpenFileInfo,_true> *files,
          vector<duckdb::LogicalType,_true> *union_col_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *union_col_names,ParquetOptions *options,MultiFileOptions *file_options)

{
  pointer psVar1;
  const_reference pvVar2;
  BaseExecutorTask *this_00;
  BaseUnionData *pBVar3;
  BaseUnionData *pBVar4;
  shared_ptr<duckdb::BaseUnionData,_true> *reader;
  size_type __n;
  pointer this_01;
  pointer *__ptr;
  case_insensitive_map_t<idx_t> union_names_map;
  TaskExecutor executor;
  BaseExecutorTask *local_108;
  vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> *local_100;
  vector<duckdb::OpenFileInfo,_true> *local_f8;
  vector *local_f0;
  UnionByName *local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d8;
  TaskExecutor local_a0 [112];
  
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = __return_storage_ptr__;
  local_f8 = files;
  local_f0 = (vector *)union_col_types;
  local_e0 = union_col_names;
  std::
  vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ::resize(&__return_storage_ptr__->
            super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
           ,(*(long *)(context + 8) - *(long *)context >> 4) * -0x5555555555555555);
  local_e8 = this;
  duckdb::TaskExecutor::TaskExecutor(local_a0,(ClientContext *)this);
  if (*(long *)(context + 8) != *(long *)context) {
    __n = 0;
    do {
      pvVar2 = vector<duckdb::OpenFileInfo,_true>::operator[]
                         ((vector<duckdb::OpenFileInfo,_true> *)context,__n);
      this_00 = (BaseExecutorTask *)operator_new(0x58);
      duckdb::BaseExecutorTask::BaseExecutorTask(this_00,local_a0);
      *(undefined ***)this_00 = &PTR__Task_004a4820;
      *(UnionByName **)(this_00 + 0x28) = local_e8;
      *(const_reference *)(this_00 + 0x30) = pvVar2;
      *(size_type *)(this_00 + 0x38) = __n;
      *(vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> **)(this_00 + 0x40) =
           local_100;
      *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        **)(this_00 + 0x48) = local_e0;
      *(ParquetOptions **)(this_00 + 0x50) = options;
      local_108 = this_00;
      duckdb::TaskExecutor::ScheduleTask(local_a0,&local_108);
      if (local_108 != (BaseExecutorTask *)0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
      local_108 = (BaseExecutorTask *)0x0;
      __n = __n + 1;
    } while (__n < (ulong)((*(long *)(context + 8) - *(long *)context >> 4) * -0x5555555555555555));
  }
  duckdb::TaskExecutor::WorkOnTasks();
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  this_01 = (local_100->
            super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
            ).
            super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (local_100->
           super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
           ).
           super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != psVar1) {
    do {
      pBVar3 = shared_ptr<duckdb::BaseUnionData,_true>::operator->(this_01);
      pBVar4 = shared_ptr<duckdb::BaseUnionData,_true>::operator->(this_01);
      duckdb::UnionByName::CombineUnionTypes
                ((vector *)&pBVar3->names,(vector *)&pBVar4->types,(vector *)local_f8,local_f0,
                 (unordered_map *)&local_d8);
      this_01 = this_01 + 1;
    } while (this_01 != psVar1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_d8);
  duckdb::TaskExecutor::~TaskExecutor(local_a0);
  return local_100;
}

Assistant:

static vector<shared_ptr<BaseUnionData>>
	UnionCols(ClientContext &context, const vector<OpenFileInfo> &files, vector<LogicalType> &union_col_types,
	          vector<string> &union_col_names, OPTIONS_TYPE &options, MultiFileOptions &file_options) {
		vector<shared_ptr<BaseUnionData>> union_readers;
		union_readers.resize(files.size());

		TaskExecutor executor(context);
		// schedule tasks for all files
		for (idx_t file_idx = 0; file_idx < files.size(); ++file_idx) {
			auto task = make_uniq<UnionByReaderTask<OP, OPTIONS_TYPE>>(executor, context, files[file_idx], file_idx,
			                                                           union_readers, options, file_options);
			executor.ScheduleTask(std::move(task));
		}
		// complete all tasks
		executor.WorkOnTasks();

		// now combine the result schemas
		case_insensitive_map_t<idx_t> union_names_map;
		for (auto &reader : union_readers) {
			auto &col_names = reader->names;
			auto &sql_types = reader->types;
			CombineUnionTypes(col_names, sql_types, union_col_types, union_col_names, union_names_map);
		}
		return union_readers;
	}